

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

int __thiscall
booster::locale::util::gregorian_calendar::difference
          (gregorian_calendar *this,abstract_calendar *other_cal,period_mark p)

{
  undefined4 in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int diff_2;
  int diff_1;
  int diff;
  int factor;
  gregorian_calendar *other;
  unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
  keeper;
  pointer in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  gregorian_calendar *in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  period_mark p_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  pointer local_80;
  int local_54;
  undefined1 local_50 [2] [12];
  pointer local_30;
  undefined4 local_1c;
  long *local_18;
  int local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::
  unique_ptr<booster::locale::util::gregorian_calendar,std::default_delete<booster::locale::util::gregorian_calendar>>
  ::unique_ptr<std::default_delete<booster::locale::util::gregorian_calendar>,void>
            ((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (local_18 == (long *)0x0) {
    local_80 = (pointer)0x0;
  }
  else {
    local_80 = (pointer)__dynamic_cast(local_18,&abstract_calendar::typeinfo,&typeinfo,0);
  }
  local_30 = local_80;
  if (local_80 == (pointer)0x0) {
    (**(code **)*in_RDI)();
    in_stack_ffffffffffffff58 = (gregorian_calendar *)&stack0xffffffffffffffd8;
    std::
    unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
    ::reset((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
            in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff60 =
         std::
         unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
         ::operator->((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                       *)0x2a5fd8);
    local_50[0] = (**(code **)(*local_18 + 0x28))();
    in_stack_ffffffffffffff6c = local_50[0]._8_4_;
    (*(in_stack_ffffffffffffff60->super_abstract_calendar)._vptr_abstract_calendar[4])
              (in_stack_ffffffffffffff60,local_50);
    local_30 = std::
               unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
               ::get((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                      *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  local_54 = 1;
  p_00 = (period_mark)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  switch(local_1c) {
  case 1:
    local_4 = 0;
    break;
  case 2:
  case 3:
    local_4 = get_diff((gregorian_calendar *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),p_00,
                       (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 4:
    local_4 = get_diff((gregorian_calendar *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),p_00,
                       (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 8:
  case 0xf:
  case 0x10:
    local_54 = 7;
  case 5:
  case 6:
  case 7:
  case 9:
    if ((local_30->tm_).tm_year != *(int *)((long)in_RDI + 0x2c)) {
      in_stack_ffffffffffffff44 = anon_unknown_0::days_from_0((local_30->tm_).tm_year + 0x76c);
      anon_unknown_0::days_from_0(*(int *)((long)in_RDI + 0x2c) + 0x76c);
    }
    in_stack_ffffffffffffff40 =
         get_diff((gregorian_calendar *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  (period_mark)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                  (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = in_stack_ffffffffffffff40 / local_54;
    break;
  case 10:
  case 0xb:
    local_4 = (int)((local_30->time_ - in_RDI[2]) / 0xe10);
    break;
  case 0xc:
    local_4 = (int)((local_30->time_ - in_RDI[2]) / 0xa8c0);
    break;
  case 0xd:
    local_4 = (int)((local_30->time_ - in_RDI[2]) / 0x3c);
    break;
  case 0xe:
    local_4 = (int)local_30->time_ - (int)in_RDI[2];
    break;
  default:
    local_4 = 0;
  }
  std::
  unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
  ::~unique_ptr((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return local_4;
}

Assistant:

virtual int difference(abstract_calendar const *other_cal,period::marks::period_mark p) const 
            {
                std::unique_ptr<gregorian_calendar> keeper;
                gregorian_calendar const *other = dynamic_cast<gregorian_calendar const *>(other_cal);
                if(!other) {
                    keeper.reset(clone());
                    keeper->set_time(other_cal->get_time());
                    other = keeper.get();
                }

                int factor = 1; // for weeks vs days handling

                using namespace period::marks;
                switch(p) {
                case era:
                    return 0;
                case year:
                case extended_year:
                    {
                        int diff = other->tm_.tm_year - tm_.tm_year;
                        return get_diff(period::marks::year,diff,other);
                    }
                case month:
                    {
                        int diff = 12 * (other->tm_.tm_year - tm_.tm_year) 
                                    + other->tm_.tm_mon - tm_.tm_mon;
                        return get_diff(period::marks::month,diff,other);
                    }
                case day_of_week_in_month:
                case week_of_month:
                case week_of_year:
                    factor = 7;
                    // fall 
                case day:
                case day_of_year:
                case day_of_week:
                case day_of_week_local:
                    {
                        int diff = other->tm_.tm_yday - tm_.tm_yday;
                        if(other->tm_.tm_year != tm_.tm_year) {
                            diff += days_from_0(other->tm_.tm_year + 1900) -
                                    days_from_0(tm_.tm_year + 1900);
                        }
                        return get_diff(period::marks::day,diff,other) / factor;
                    }
                case am_pm:
                    return static_cast<int>( (other->time_ - time_) / (3600*12) );
                case hour:
                case hour_12:
                    return static_cast<int>( (other->time_ - time_) / 3600 );
                case minute:
                    return static_cast<int>( (other->time_ - time_) / 60 );
                case second:
                    return static_cast<int>( other->time_ - time_  );
                default:
                    return 0;
                };
            }